

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_dqt_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  jpgd_quant_t *pjVar3;
  jpeg_decoder *in_RDI;
  undefined1 unaff_retaddr;
  size_t in_stack_00000008;
  jpeg_decoder *in_stack_00000010;
  uint temp;
  uint num_left;
  int prec;
  int i;
  int n;
  jpgd_status in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_1c;
  uint local_18;
  uint local_10;
  
  uVar1 = get_bits(in_RDI,in_stack_ffffffffffffffd4);
  if (uVar1 < 2) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  }
  local_18 = uVar1 - 2;
  while( true ) {
    if (local_18 == 0) {
      return;
    }
    uVar1 = get_bits(in_RDI,in_stack_ffffffffffffffd4);
    uVar2 = uVar1 & 0xf;
    if (3 < uVar2) break;
    if (in_RDI->m_quant[(int)uVar2] == (jpgd_quant_t *)0x0) {
      pjVar3 = (jpgd_quant_t *)alloc(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
      in_RDI->m_quant[(int)uVar2] = pjVar3;
    }
    for (local_10 = 0; (int)local_10 < 0x40; local_10 = local_10 + 1) {
      local_1c = get_bits(in_RDI,in_stack_ffffffffffffffd4);
      if ((int)uVar1 >> 4 != 0) {
        in_stack_ffffffffffffffd4 = local_1c << 8;
        local_1c = get_bits(in_RDI,in_stack_ffffffffffffffd4);
        local_1c = in_stack_ffffffffffffffd4 + local_1c;
      }
      in_RDI->m_quant[(int)uVar2][(int)local_10] = (jpgd_quant_t)local_1c;
    }
    local_10 = 0x41;
    if ((int)uVar1 >> 4 != 0) {
      local_10 = 0x81;
    }
    if (local_18 < local_10) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc);
    }
    local_18 = local_18 - local_10;
  }
  stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc);
}

Assistant:

void jpeg_decoder::read_dqt_marker() {
  int n, i, prec;
  uint num_left;
  uint temp;

  num_left = get_bits(16);

  if (num_left < 2)
    stop_decoding(JPGD_BAD_DQT_MARKER);

  num_left -= 2;

  while (num_left) {
    n = get_bits(8);
    prec = n >> 4;
    n &= 0x0F;

    if (n >= JPGD_MAX_QUANT_TABLES)
      stop_decoding(JPGD_BAD_DQT_TABLE);

    if (!m_quant[n])
      m_quant[n] = (jpgd_quant_t*)alloc(64 * sizeof(jpgd_quant_t));

    // read quantization entries, in zag order
    for (i = 0; i < 64; i++) {
      temp = get_bits(8);

      if (prec)
        temp = (temp << 8) + get_bits(8);

      m_quant[n][i] = static_cast<jpgd_quant_t>(temp);
    }

    i = 64 + 1;

    if (prec)
      i += 64;

    if (num_left < (uint)i)
      stop_decoding(JPGD_BAD_DQT_LENGTH);

    num_left -= i;
  }
}